

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::compile_compute_shader(NegativeTestContext *ctx)

{
  GLint compileStatus;
  char *computeShaderSource;
  allocator<char> local_3d;
  int local_3c;
  char *local_38;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Compile Computer Shader",(allocator<char> *)&local_38);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  local_38 = "#version 300 es\nvoid main (void)\n{\n}\n";
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Compute Shader should not have compiled with #version 300 es.",
               &local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = "#version 310 es\nbuffer SSBO { vec4 data }void main (void)\n{\n}\n";
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Compute Shader should not have compiled: incorrect SSBO syntax."
               ,&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = "#version 310 es\nbuffer SSBO { vec4 data;};uniform mat4 data;void main (void)\n{\n}\n"
  ;
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: buffer variable redefinition.",&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = "#version 310 es\nbuffer SSBO { vec4 data[]; vec4 moreData;};void main (void)\n{\n}\n";
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: unspecified length buffer member not at the end."
               ,&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = "#version 310 es\nin vec4 data;void main (void)\n{\n}\n";
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Compute Shader should not have compiled: input qualifier used.",
               &local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = "#version 310 es\nshared uint data = 0;";
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: shared-qualified variable initialized.",
               &local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = 
  "#version 310 es\nbuffer SSBO { vec4 data; vec4 moreData[];} ssbo;void test (vec4 data[10]) {}void main (void)\n{\n    test(ssbo.moreData);}\n"
  ;
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: unspecified length buffer member passed as argument to function."
               ,&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = 
  "#version 310 es\nbuffer SSBO { vec4 data; vec4 moreData[];} ssbo;void main (void)\n{\n    vec4 var = ssbo.moreData[-1];}\n"
  ;
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: unspecified length buffer member indexed with negative constant expression."
               ,&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = 
  "#version 310 es\nlayout(binding=-1) buffer SSBO { vec4 data;};void main (void)\n{\n}\n";
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: binding point less than zero.",&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = 
  "#version 310 es\nlayout(binding=1) buffer;layout(binding=2) buffer SSBO { vec4 data;};void main (void)\n{\n}\n"
  ;
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: binding point specified for global scope.",
               &local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = 
  "#version 310 es\nbuffer SSBO {\tlayout(binding=1) vec4 data;\tlayout(binding=2) vec4 moreData[];} ssbo;void main (void)\n{\n}\n"
  ;
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: binding point specified for block member declarations."
               ,&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = 
  "#version 310 es\nreadonly buffer SSBO {vec4 data;} ssbo;void main (void)\n{\nssbo.data = vec4(1, 1, 1, 1);}\n"
  ;
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: writing to buffer block qualified with readonly."
               ,&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  local_38 = 
  "#version 310 es\nwriteonly buffer SSBO {vec4 data;} ssbo;void main (void)\n{\nvec4 var = ssbo.data;}\n"
  ;
  compile_compute_shader_helper(ctx,&local_38,&local_3c);
  if (local_3c != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "Compute Shader should not have compiled: reading from buffer block qualified with writeonly."
               ,&local_3d);
    NegativeTestContext::fail(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void compile_compute_shader (NegativeTestContext& ctx)
{
	GLint compileStatus;
	ctx.beginSection("Compile Computer Shader");

	{
		const char* const computeShaderSource		=	"#version 300 es\n"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled with #version 300 es.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data }"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: incorrect SSBO syntax.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data;};"
														"uniform mat4 data;"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: buffer variable redefinition.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data[]; vec4 moreData;};"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: unspecified length buffer member not at the end.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"in vec4 data;"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: input qualifier used.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"shared uint data = 0;";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: shared-qualified variable initialized.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data; vec4 moreData[];} ssbo;"
														"void test (vec4 data[10]) {}"
														"void main (void)\n"
														"{\n"
														"    test(ssbo.moreData);"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: unspecified length buffer member passed as argument to function.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO { vec4 data; vec4 moreData[];} ssbo;"
														"void main (void)\n"
														"{\n"
														"    vec4 var = ssbo.moreData[-1];"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: unspecified length buffer member indexed with negative constant expression.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"layout(binding=-1) buffer SSBO { vec4 data;};"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: binding point less than zero.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"layout(binding=1) buffer;"
														"layout(binding=2) buffer SSBO { vec4 data;};"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: binding point specified for global scope.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"buffer SSBO {"
														"	layout(binding=1) vec4 data;"
														"	layout(binding=2) vec4 moreData[];"
														"} ssbo;"
														"void main (void)\n"
														"{\n"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: binding point specified for block member declarations.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"readonly buffer SSBO {vec4 data;} ssbo;"
														"void main (void)\n"
														"{\n"
															"ssbo.data = vec4(1, 1, 1, 1);"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: writing to buffer block qualified with readonly.");
	}
	{
		const char* const computeShaderSource		=	"#version 310 es\n"
														"writeonly buffer SSBO {vec4 data;} ssbo;"
														"void main (void)\n"
														"{\n"
															"vec4 var = ssbo.data;"
														"}\n";

		compile_compute_shader_helper(ctx, &computeShaderSource, &compileStatus);
		if (compileStatus != GL_FALSE)
			ctx.fail("Compute Shader should not have compiled: reading from buffer block qualified with writeonly.");
	}

	ctx.endSection();
}